

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

void __thiscall svm_example::~svm_example(svm_example *this)

{
  flat_example *fec;
  
  v_array<float>::delete_v(&this->krow);
  fec = calloc_or_throw<flat_example>();
  memcpy(fec,&this->ex,200);
  free_flatten_example(fec);
  return;
}

Assistant:

svm_example::~svm_example()
{
  krow.delete_v();
  // free flatten example contents
  flat_example* fec = &calloc_or_throw<flat_example>();
  *fec = ex;
  free_flatten_example(fec);  // free contents of flat example and frees fec.
}